

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O0

void __thiscall LinkageUntangler::report_selection(LinkageUntangler *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  undefined8 *in_RDI;
  int n;
  uint64_t selected_count;
  uint64_t selected_bp;
  uint64_t total_count;
  uint64_t total_bp;
  reference in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar7;
  ulong uVar8;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  local_10 = 0;
  local_18 = 0;
  local_20 = 0;
  uVar8 = 0;
  for (iVar7 = 1; uVar6 = (ulong)iVar7,
      sVar2 = std::vector<Node,_std::allocator<Node>_>::size
                        ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40)),
      uVar6 < sVar2; iVar7 = iVar7 + 1) {
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[]
                       ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40),(long)iVar7
                       );
    if (pvVar3->status != Deleted) {
      std::vector<Node,_std::allocator<Node>_>::operator[]
                ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40),(long)iVar7);
      lVar4 = std::__cxx11::string::size();
      local_10 = lVar4 + local_10;
      local_18 = local_18 + 1;
      in_stack_ffffffffffffffc0 =
           std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)
                      CONCAT44(iVar7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc0._M_mask);
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffc0)
      ;
      if (bVar1) {
        std::vector<Node,_std::allocator<Node>_>::operator[]
                  ((vector<Node,_std::allocator<Node>_> *)(*(long *)*in_RDI + 0x40),(long)iVar7);
        lVar4 = std::__cxx11::string::size();
        local_20 = lVar4 + local_20;
        uVar8 = uVar8 + 1;
      }
    }
  }
  poVar5 = sdglib::OutputLog((LogLevels)(uVar8 >> 0x20),SUB81(uVar8 >> 0x18,0));
  poVar5 = std::operator<<(poVar5,"Current selection: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar8);
  poVar5 = std::operator<<(poVar5," / ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
  poVar5 = std::operator<<(poVar5," nodes  with  ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20);
  poVar5 = std::operator<<(poVar5," / ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_10);
  poVar5 = std::operator<<(poVar5," bp");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LinkageUntangler::report_selection() {
    uint64_t total_bp=0,total_count=0,selected_bp=0,selected_count=0;
    for (auto n=1;n<dg.sdg.nodes.size();++n) {
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted) continue;
        total_bp+=dg.sdg.nodes[n].sequence.size();
        ++total_count;
        if (selected_nodes[n]) {
            selected_bp += dg.sdg.nodes[n].sequence.size();
            ++selected_count;
        }
    }
        sdglib::OutputLog()<< "Current selection: "<<selected_count<<" / "<<total_count<<" nodes  with  "<<selected_bp<<" / "<<total_bp<<" bp"<<std::endl;

}